

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

void __thiscall
duckdb::GetIgnoredCodepoints
          (duckdb *this,string_t ignored,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
          *ignored_codepoints)

{
  utf8proc_ssize_t uVar1;
  __hashtable *__h;
  ulong uVar2;
  long lVar3;
  utf8proc_int32_t codepoint;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_50;
  utf8proc_int32_t local_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = ignored.value._0_8_;
  lVar3 = local_38;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_40 + 4;
  }
  if ((uint)this != 0) {
    uVar2 = 0;
    local_40 = this;
    do {
      uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(lVar3 + uVar2),
                               ((ulong)this & 0xffffffff) - uVar2,&local_44);
      uVar2 = uVar2 + uVar1;
      local_50 = ignored.value._8_8_;
      ::std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                (ignored.value._8_8_,&local_44,&local_50);
    } while (uVar2 < ((ulong)this & 0xffffffff));
  }
  return;
}

Assistant:

static void GetIgnoredCodepoints(string_t ignored, unordered_set<utf8proc_int32_t> &ignored_codepoints) {
	auto dataptr = reinterpret_cast<const utf8proc_uint8_t *>(ignored.GetData());
	auto size = ignored.GetSize();
	idx_t pos = 0;
	while (pos < size) {
		utf8proc_int32_t codepoint;
		pos += UnsafeNumericCast<idx_t>(
		    utf8proc_iterate(dataptr + pos, UnsafeNumericCast<utf8proc_ssize_t>(size - pos), &codepoint));
		ignored_codepoints.insert(codepoint);
	}
}